

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPDefaultClause::generateDOT
          (OpenMPDefaultClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  OpenMPDirective *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string clause_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string indent;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string current_line;
  string parameter_string;
  
  parameter_string._M_dataplus._M_p = (pointer)&parameter_string.field_2;
  parameter_string._M_string_length = 0;
  parameter_string.field_2._M_local_buf[0] = '\0';
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)depth);
  clause_string._M_dataplus._M_p = (pointer)&clause_string.field_2;
  clause_string._M_string_length = 0;
  clause_string.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::substr((ulong)&local_170,(ulong)parent_node);
  std::__cxx11::string::operator=((string *)parent_node,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::assign((char *)&clause_string);
  std::operator+(&local_b0,parent_node,"_");
  std::operator+(&local_90,&local_b0,&clause_string);
  std::operator+(&local_1f0,&local_90,"_");
  std::__cxx11::to_string(&local_d0,depth);
  std::operator+(&local_1d0,&local_1f0,&local_d0);
  std::operator+(&local_1b0,&local_1d0,"_");
  std::__cxx11::to_string(&local_f0,index);
  std::operator+(&local_170,&local_1b0,&local_f0);
  std::__cxx11::string::operator=((string *)&clause_string,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_1f0,&indent,parent_node);
  std::operator+(&local_1d0,&local_1f0," -- ");
  std::operator+(&local_1b0,&local_1d0,&clause_string);
  std::operator+(&local_170,&local_1b0,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::operator<<((ostream *)dot_file,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  this_00 = this->variant_directive;
  if (this_00 != (OpenMPDirective *)0x0) {
    std::__cxx11::string::string((string *)&local_110,(string *)&clause_string);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"",(allocator<char> *)&local_170);
    OpenMPDirective::generateDOT(this_00,dot_file,depth + 1,0,&local_110,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::~string((string *)&clause_string);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&current_line);
  std::__cxx11::string::~string((string *)&parameter_string);
  return;
}

Assistant:

void OpenMPDefaultClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string parameter_string;
    OpenMPDirective* variant_directive = NULL;
    std::string current_line;
    std::string indent = std::string(depth, '\t');
    std::string clause_string;
    //std::vector<OpenMPDirective*>* parameter_directives;
    parent_node = parent_node.substr(0, parent_node.size()-1);
    //OpenMPClauseKind clause_kind = this->getKind();

    clause_string = "default";

    clause_string = parent_node + "_" + clause_string + "_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + " -- " + clause_string + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    variant_directive = ((OpenMPDefaultClause*)this)->getVariantDirective();
    if (variant_directive != NULL) {
        variant_directive->generateDOT(dot_file, depth+1, 0, clause_string, "");
    };
}